

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_ObjCollectCopyFanins(Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  Wlc_Obj_t *pWVar1;
  int *piVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  
  if ((iObj < 1) || (p->nObjsAlloc <= iObj)) {
    __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                  ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
  }
  pWVar1 = p->pObjs + (uint)iObj;
  vFanins->nSize = 0;
  uVar7 = (ulong)pWVar1->nFanins;
  if (0 < (int)pWVar1->nFanins) {
    lVar9 = 0;
    do {
      if ((2 < (uint)uVar7) || (paVar6 = &pWVar1->field_10, (*(uint *)pWVar1 & 0x3f | 0x10) == 0x16)
         ) {
        paVar6 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
      }
      iVar8 = paVar6->Fanins[lVar9];
      if (((long)iVar8 < 0) || ((p->vCopies).nSize <= iVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(vFanins,(p->vCopies).pArray[iVar8]);
      lVar9 = lVar9 + 1;
      uVar7 = (ulong)(int)pWVar1->nFanins;
    } while (lVar9 < (long)uVar7);
  }
  uVar3 = *(ushort *)pWVar1 & 0x3f;
  if (uVar3 == 0x35) {
    if (vFanins->nSize != 1) {
      __assert_fail("Vec_IntSize(vFanins) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                    ,0x39e,"void Wlc_ObjCollectCopyFanins(Wlc_Ntk_t *, int, Vec_Int_t *)");
    }
    iVar8 = (pWVar1->field_10).Fanins[1];
  }
  else {
    if (uVar3 != 0x16) {
      if (uVar3 == 6) {
        iVar4 = pWVar1->End - pWVar1->Beg;
        iVar8 = -iVar4;
        if (0 < iVar4) {
          iVar8 = iVar4;
        }
        uVar5 = (uint)((iVar8 + 1U & 0x1f) != 0) + (iVar8 + 1U >> 5);
        if (uVar5 != 0) {
          piVar2 = (pWVar1->field_10).pFanins[0];
          lVar9 = 0;
          do {
            Vec_IntPush(vFanins,*(int *)((long)piVar2 + lVar9));
            lVar9 = lVar9 + 4;
          } while ((ulong)uVar5 << 2 != lVar9);
        }
      }
      return;
    }
    if (vFanins->nSize != 1) {
      __assert_fail("Vec_IntSize(vFanins) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                    ,0x399,"void Wlc_ObjCollectCopyFanins(Wlc_Ntk_t *, int, Vec_Int_t *)");
    }
    iVar8 = (pWVar1->field_10).pFanins[0][2];
    Vec_IntPush(vFanins,(pWVar1->field_10).pFanins[0][1]);
  }
  Vec_IntPush(vFanins,iVar8);
  return;
}

Assistant:

void Wlc_ObjCollectCopyFanins( Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    int i, iFanin;
    Wlc_Obj_t * pObj = Wlc_NtkObj( p, iObj );
    Vec_IntClear( vFanins );
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Vec_IntPush( vFanins, Wlc_ObjCopy(p, iFanin) );
    // special treatment of CONST and SELECT
    if ( pObj->Type == WLC_OBJ_CONST )
    {
        int * pInts = Wlc_ObjConstValue( pObj );
        int nInts = Abc_BitWordNum( Wlc_ObjRange(pObj) );
        for ( i = 0; i < nInts; i++ )
            Vec_IntPush( vFanins, pInts[i] );
    }
    else if ( pObj->Type == WLC_OBJ_BIT_SELECT )
    {
        assert( Vec_IntSize(vFanins) == 1 );
        Vec_IntPushTwo( vFanins, Wlc_ObjRangeEnd(pObj), Wlc_ObjRangeBeg(pObj) );
    }
    else if ( pObj->Type == WLC_OBJ_TABLE )
    {
        assert( Vec_IntSize(vFanins) == 1 );
        Vec_IntPush( vFanins, pObj->Fanins[1] );
    }
}